

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlAddChild(xmlNodePtr parent,xmlNodePtr cur)

{
  _xmlNode *p_Var1;
  _xmlNode *local_38;
  xmlAttrPtr lastattr_1;
  xmlAttrPtr lastattr;
  xmlNodePtr prev;
  xmlNodePtr cur_local;
  xmlNodePtr parent_local;
  
  if ((parent == (xmlNodePtr)0x0) || (parent->type == XML_NAMESPACE_DECL)) {
    parent_local = (xmlNodePtr)0x0;
  }
  else if ((cur == (xmlNodePtr)0x0) || (cur->type == XML_NAMESPACE_DECL)) {
    parent_local = (xmlNodePtr)0x0;
  }
  else if (parent == cur) {
    parent_local = (xmlNodePtr)0x0;
  }
  else {
    if (cur->type == XML_TEXT_NODE) {
      if (((parent->type == XML_TEXT_NODE) && (parent->content != (xmlChar *)0x0)) &&
         (parent->name == cur->name)) {
        xmlNodeAddContent(parent,cur->content);
        xmlFreeNode(cur);
        return parent;
      }
      if (((parent->last != (_xmlNode *)0x0) && (parent->last->type == XML_TEXT_NODE)) &&
         ((parent->last->name == cur->name && (parent->last != cur)))) {
        xmlNodeAddContent(parent->last,cur->content);
        xmlFreeNode(cur);
        return parent->last;
      }
    }
    p_Var1 = cur->parent;
    cur->parent = parent;
    if (cur->doc != parent->doc) {
      xmlSetTreeDoc(cur,parent->doc);
    }
    parent_local = cur;
    if (p_Var1 != parent) {
      if (((parent->type == XML_TEXT_NODE) && (parent->content != (xmlChar *)0x0)) &&
         (parent != cur)) {
        xmlNodeAddContent(parent,cur->content);
        xmlFreeNode(cur);
        parent_local = parent;
      }
      else if (cur->type == XML_ATTRIBUTE_NODE) {
        if (parent->type == XML_ELEMENT_NODE) {
          if (parent->properties != (_xmlAttr *)0x0) {
            if (cur->ns == (xmlNs *)0x0) {
              lastattr_1 = xmlHasNsProp(parent,cur->name,(xmlChar *)0x0);
            }
            else {
              lastattr_1 = xmlHasNsProp(parent,cur->name,cur->ns->href);
            }
            if (((lastattr_1 != (xmlAttrPtr)0x0) && ((xmlNodePtr)lastattr_1 != cur)) &&
               (lastattr_1->type != XML_ATTRIBUTE_DECL)) {
              xmlUnlinkNode((xmlNodePtr)lastattr_1);
              xmlFreeProp(lastattr_1);
            }
            if ((xmlNodePtr)lastattr_1 == cur) {
              return cur;
            }
          }
          if (parent->properties == (_xmlAttr *)0x0) {
            parent->properties = (_xmlAttr *)cur;
          }
          else {
            for (local_38 = (_xmlNode *)parent->properties; local_38->next != (_xmlNode *)0x0;
                local_38 = local_38->next) {
            }
            local_38->next = cur;
            cur->prev = local_38;
          }
        }
        else {
          parent_local = (xmlNodePtr)0x0;
        }
      }
      else if (parent->children == (_xmlNode *)0x0) {
        parent->children = cur;
        parent->last = cur;
      }
      else {
        p_Var1 = parent->last;
        p_Var1->next = cur;
        cur->prev = p_Var1;
        parent->last = cur;
      }
    }
  }
  return parent_local;
}

Assistant:

xmlNodePtr
xmlAddChild(xmlNodePtr parent, xmlNodePtr cur) {
    xmlNodePtr prev;

    if ((parent == NULL) || (parent->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddChild : parent == NULL\n");
#endif
	return(NULL);
    }

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddChild : child == NULL\n");
#endif
	return(NULL);
    }

    if (parent == cur) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlAddChild : parent == cur\n");
#endif
	return(NULL);
    }
    /*
     * If cur is a TEXT node, merge its content with adjacent TEXT nodes
     * cur is then freed.
     */
    if (cur->type == XML_TEXT_NODE) {
	if ((parent->type == XML_TEXT_NODE) &&
	    (parent->content != NULL) &&
	    (parent->name == cur->name)) {
	    xmlNodeAddContent(parent, cur->content);
	    xmlFreeNode(cur);
	    return(parent);
	}
	if ((parent->last != NULL) && (parent->last->type == XML_TEXT_NODE) &&
	    (parent->last->name == cur->name) &&
	    (parent->last != cur)) {
	    xmlNodeAddContent(parent->last, cur->content);
	    xmlFreeNode(cur);
	    return(parent->last);
	}
    }

    /*
     * add the new element at the end of the children list.
     */
    prev = cur->parent;
    cur->parent = parent;
    if (cur->doc != parent->doc) {
	xmlSetTreeDoc(cur, parent->doc);
    }
    /* this check prevents a loop on tree-traversions if a developer
     * tries to add a node to its parent multiple times
     */
    if (prev == parent)
	return(cur);

    /*
     * Coalescing
     */
    if ((parent->type == XML_TEXT_NODE) &&
	(parent->content != NULL) &&
	(parent != cur)) {
	xmlNodeAddContent(parent, cur->content);
	xmlFreeNode(cur);
	return(parent);
    }
    if (cur->type == XML_ATTRIBUTE_NODE) {
		if (parent->type != XML_ELEMENT_NODE)
			return(NULL);
	if (parent->properties != NULL) {
	    /* check if an attribute with the same name exists */
	    xmlAttrPtr lastattr;

	    if (cur->ns == NULL)
		lastattr = xmlHasNsProp(parent, cur->name, NULL);
	    else
		lastattr = xmlHasNsProp(parent, cur->name, cur->ns->href);
	    if ((lastattr != NULL) && (lastattr != (xmlAttrPtr) cur) && (lastattr->type != XML_ATTRIBUTE_DECL)) {
		/* different instance, destroy it (attributes must be unique) */
			xmlUnlinkNode((xmlNodePtr) lastattr);
		xmlFreeProp(lastattr);
	    }
		if (lastattr == (xmlAttrPtr) cur)
			return(cur);

	}
	if (parent->properties == NULL) {
	    parent->properties = (xmlAttrPtr) cur;
	} else {
	    /* find the end */
	    xmlAttrPtr lastattr = parent->properties;
	    while (lastattr->next != NULL) {
		lastattr = lastattr->next;
	    }
	    lastattr->next = (xmlAttrPtr) cur;
	    ((xmlAttrPtr) cur)->prev = lastattr;
	}
    } else {
	if (parent->children == NULL) {
	    parent->children = cur;
	    parent->last = cur;
	} else {
	    prev = parent->last;
	    prev->next = cur;
	    cur->prev = prev;
	    parent->last = cur;
	}
    }
    return(cur);
}